

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O3

void Diligent::ValidatePSOCreateInfo<Diligent::ComputePipelineStateCreateInfo>
               (IRenderDevice *pDevice,ComputePipelineStateCreateInfo *CreateInfo)

{
  char (*in_RCX) [19];
  string msg;
  string local_30;
  
  if (pDevice != (IRenderDevice *)0x0) {
    anon_unknown_61::ValidateComputePipelineCreateInfo(CreateInfo,pDevice);
    return;
  }
  FormatString<char[26],char[19]>
            (&local_30,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x751392,in_RCX);
  DebugAssertionFailed
            (local_30._M_dataplus._M_p,"ValidatePSOCreateInfo",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
             ,0x3b6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  anon_unknown_61::ValidateComputePipelineCreateInfo(CreateInfo,(IRenderDevice *)0x0);
  return;
}

Assistant:

void ValidatePSOCreateInfo<ComputePipelineStateCreateInfo>(const IRenderDevice*                  pDevice,
                                                           const ComputePipelineStateCreateInfo& CreateInfo) noexcept(false)
{
    VERIFY_EXPR(pDevice != nullptr);
    ValidateComputePipelineCreateInfo(CreateInfo, pDevice);
}